

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall
tetgenmesh::checkfac4split(tetgenmesh *this,face *chkfac,point *encpt,int *qflag,double *cent)

{
  shellface *pppdVar1;
  shellface ppdVar2;
  shellface ppdVar3;
  shellface ppdVar4;
  double *pdVar5;
  bool bVar6;
  uint uVar7;
  undefined4 *puVar8;
  int iVar9;
  shellface ppdVar10;
  tetgenmesh *ptVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  int indx [4];
  double rhs [4];
  double D;
  double A [4] [4];
  int local_f8 [4];
  double local_e8;
  double local_e0;
  double local_d8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_98;
  double local_90;
  double local_88;
  double local_78;
  double local_70;
  double local_68;
  
  *encpt = (point)0x0;
  *qflag = 0;
  pppdVar1 = chkfac->sh;
  iVar9 = chkfac->shver;
  ppdVar2 = pppdVar1[sorgpivot[iVar9]];
  ppdVar3 = pppdVar1[sdestpivot[iVar9]];
  ppdVar4 = pppdVar1[sapexpivot[iVar9]];
  dVar15 = (double)*ppdVar3 - (double)*ppdVar2;
  dVar19 = (double)ppdVar3[1] - (double)ppdVar2[1];
  dVar17 = (double)ppdVar3[2] - (double)ppdVar2[2];
  dVar16 = (double)*ppdVar4 - (double)*ppdVar2;
  dVar20 = (double)ppdVar4[1] - (double)ppdVar2[1];
  dVar18 = (double)ppdVar4[2] - (double)ppdVar2[2];
  local_78 = dVar19 * dVar18 - dVar17 * dVar20;
  dVar14 = dVar15 * dVar18 - dVar17 * dVar16;
  local_70 = -dVar14;
  local_68 = dVar15 * dVar20 - dVar19 * dVar16;
  dVar14 = local_68 * local_68 + local_78 * local_78 + dVar14 * dVar14;
  ptVar11 = this;
  local_b8 = dVar15;
  local_b0 = dVar19;
  local_a8 = dVar17;
  local_98 = dVar16;
  local_90 = dVar20;
  local_88 = dVar18;
  if (dVar14 < 0.0) {
    dVar14 = sqrt(dVar14);
  }
  else {
    dVar14 = SQRT(dVar14);
  }
  local_e8 = (dVar17 * dVar17 + dVar15 * dVar15 + dVar19 * dVar19) * 0.5;
  local_e0 = (dVar18 * dVar18 + dVar16 * dVar16 + dVar20 * dVar20) * 0.5;
  local_d8 = 0.0;
  bVar6 = lu_decmp(ptVar11,(double (*) [4])&local_b8,3,local_f8,&local_c0,0);
  if (!bVar6) {
    puVar8 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar8 = 2;
    __cxa_throw(puVar8,&int::typeinfo,0);
  }
  lu_solve(ptVar11,(double (*) [4])&local_b8,3,local_f8,&local_e8,0);
  *cent = (double)*ppdVar2 + local_e8;
  cent[1] = (double)ppdVar2[1] + local_e0;
  cent[2] = (double)ppdVar2[2] + local_d8;
  dVar15 = local_d8 * local_d8 + local_e8 * local_e8 + local_e0 * local_e0;
  if (dVar15 < 0.0) {
    dVar15 = sqrt(dVar15);
  }
  else {
    dVar15 = SQRT(dVar15);
  }
  dVar14 = dVar14 * 0.5;
  if (((this->checkconstraints != 0) && (0.0 < (double)chkfac->sh[this->areaboundindex])) &&
     ((double)chkfac->sh[this->areaboundindex] < dVar14)) {
LAB_0014b28e:
    *qflag = 1;
    return 1;
  }
  if (this->b->fixedvolume != 0) {
    if (dVar14 < 0.0) {
      dVar16 = sqrt(dVar14);
    }
    else {
      dVar16 = SQRT(dVar14);
    }
    pdVar5 = &this->b->maxvolume;
    if (*pdVar5 <= dVar16 * dVar14 && dVar16 * dVar14 != *pdVar5) goto LAB_0014b28e;
  }
  if (this->b->varvolume != 0) {
    ppdVar10 = chkfac->sh[(ulong)(chkfac->shver & 1) + 9];
    uVar12 = (ulong)ppdVar10 & 0xfffffffffffffff0;
    if (uVar12 != 0) {
      ppdVar10 = (shellface)(ulong)(uint)stpivottbl[(uint)ppdVar10 & 0xf][chkfac->shver];
    }
    if ((*(point *)(uVar12 + 0x38) != this->dummypoint) &&
       (dVar16 = *(double *)(uVar12 + (long)this->volumeboundindex * 8), 0.0 < dVar16)) {
      if (dVar14 < 0.0) {
        dVar17 = sqrt(dVar14);
      }
      else {
        dVar17 = SQRT(dVar14);
      }
      if (dVar16 < dVar17 * dVar14) {
        *qflag = 1;
        return 1;
      }
    }
    uVar12 = *(ulong *)(uVar12 + (ulong)((uint)ppdVar10 & 3) * 8) & 0xfffffffffffffff0;
    if ((*(point *)(uVar12 + 0x38) != this->dummypoint) &&
       (dVar16 = *(double *)(uVar12 + (long)this->volumeboundindex * 8), 0.0 < dVar16)) {
      if (dVar14 < 0.0) {
        dVar17 = sqrt(dVar14);
      }
      else {
        dVar17 = SQRT(dVar14);
      }
      if (dVar16 < dVar14 * dVar17) goto LAB_0014b28e;
    }
  }
  if (this->b->metric != 0) {
    iVar9 = this->pointmtrindex;
    if ((((0.0 < (double)ppdVar2[iVar9]) && ((double)ppdVar2[iVar9] < dVar15)) ||
        ((0.0 < (double)ppdVar3[iVar9] && ((double)ppdVar3[iVar9] < dVar15)))) ||
       ((0.0 < (double)ppdVar4[iVar9] && ((double)ppdVar4[iVar9] < dVar15)))) goto LAB_0014b28e;
  }
  iVar9 = 1;
  dVar14 = 0.0;
  do {
    uVar7 = (uint)chkfac->sh[(ulong)(chkfac->shver & 1) + 9] & 0xf;
    uVar12 = (ulong)chkfac->sh[(ulong)(chkfac->shver & 1) + 9] & 0xfffffffffffffff0;
    if (uVar12 != 0) {
      uVar7 = stpivottbl[uVar7][chkfac->shver];
    }
    if (*(point *)(uVar12 + 0x38) != this->dummypoint) {
      pdVar5 = *(double **)(uVar12 + (long)oppopivot[(int)uVar7] * 8);
      dVar16 = (cent[2] - pdVar5[2]) * (cent[2] - pdVar5[2]) +
               (*cent - *pdVar5) * (*cent - *pdVar5) + (cent[1] - pdVar5[1]) * (cent[1] - pdVar5[1])
      ;
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      uVar13 = -(ulong)(ABS(dVar16 - dVar15) / dVar15 < this->b->epsilon);
      dVar16 = (double)(~uVar13 & (ulong)dVar16 | uVar13 & (ulong)dVar15);
      if ((dVar16 < dVar15) && (((dVar14 == 0.0 && (!NAN(dVar14))) || (dVar16 < dVar14)))) {
        *encpt = *(point *)(uVar12 + (long)oppopivot[(int)uVar7] * 8);
        dVar14 = dVar16;
      }
    }
    *(byte *)&chkfac->shver = (byte)chkfac->shver ^ 1;
    iVar9 = iVar9 + -1;
  } while (iVar9 == 0);
  return (uint)(*encpt != (point)0x0);
}

Assistant:

int tetgenmesh::checkfac4split(face *chkfac, point& encpt, int& qflag, 
                               REAL *cent)
{
  point pa, pb, pc;
  REAL area, rd, len;
  REAL A[4][4], rhs[4], D;
  int indx[4];
  int i;

  encpt = NULL;
  qflag = 0;

  pa = sorg(*chkfac);
  pb = sdest(*chkfac);
  pc = sapex(*chkfac);

  // Compute the coefficient matrix A (3x3).
  A[0][0] = pb[0] - pa[0];
  A[0][1] = pb[1] - pa[1];
  A[0][2] = pb[2] - pa[2]; // vector V1 (pa->pb)
  A[1][0] = pc[0] - pa[0];
  A[1][1] = pc[1] - pa[1];
  A[1][2] = pc[2] - pa[2]; // vector V2 (pa->pc)
  cross(A[0], A[1], A[2]); // vector V3 (V1 X V2)

  area = 0.5 * sqrt(dot(A[2], A[2])); // The area of [a,b,c].

  // Compute the right hand side vector b (3x1).
  rhs[0] = 0.5 * dot(A[0], A[0]); // edge [a,b]
  rhs[1] = 0.5 * dot(A[1], A[1]); // edge [a,c]
  rhs[2] = 0.0;

  // Solve the 3 by 3 equations use LU decomposition with partial 
  //   pivoting and backward and forward substitute.
  if (!lu_decmp(A, 3, indx, &D, 0)) {
    // A degenerate triangle. 
    terminatetetgen(this, 2);
  }

  lu_solve(A, 3, indx, rhs, 0);
  cent[0] = pa[0] + rhs[0];
  cent[1] = pa[1] + rhs[1];
  cent[2] = pa[2] + rhs[2];
  rd = sqrt(rhs[0] * rhs[0] + rhs[1] * rhs[1] + rhs[2] * rhs[2]);

  if (checkconstraints && (areabound(*chkfac) > 0.0)) {
    // Check if the subface has too big area.
    if (area > areabound(*chkfac)) {
      qflag = 1;
      return 1;
    }
  }

  if (b->fixedvolume) {
    if ((area * sqrt(area)) > b->maxvolume) {
      qflag = 1;
      return 1;
    }
  }

  if (b->varvolume) {
    triface adjtet;
    REAL volbnd;
    int t1ver;

    stpivot(*chkfac, adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
    fsymself(adjtet);
    if (!ishulltet(adjtet)) {
      volbnd = volumebound(adjtet.tet);
      if ((volbnd > 0) && (area * sqrt(area)) > volbnd) {
        qflag = 1;
        return 1;
      }
    }
  }

  if (b->metric) { // -m option. Check mesh size. 
    // Check if the ccent lies outside one of the prot.balls at vertices.
    if (((pa[pointmtrindex] > 0) && (rd > pa[pointmtrindex])) ||
        ((pb[pointmtrindex] > 0) && (rd > pb[pointmtrindex])) ||
        ((pc[pointmtrindex] > 0) && (rd > pc[pointmtrindex]))) {
      qflag = 1; // Enforce mesh size.
      return 1;
    }
  }

  triface searchtet;
  REAL smlen = 0;

  // Check if this subface is locally encroached.
  for (i = 0; i < 2; i++) {
    stpivot(*chkfac, searchtet);
    if (!ishulltet(searchtet)) {
      len = distance(oppo(searchtet), cent);
      if ((fabs(len - rd) / rd) < b->epsilon) len = rd;// Rounding.
      if (len < rd) {
        if (smlen == 0) {
          smlen = len;
          encpt = oppo(searchtet);
        } else {
          if (len < smlen) {
            smlen = len;
            encpt = oppo(searchtet);
          }
        }
        //return 1;
      }
    }
    sesymself(*chkfac);
  }

  return encpt != NULL; //return 0;
}